

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_cookies.cpp
# Opt level: O1

void __thiscall
cppcms::sessions::session_cookies::save
          (session_cookies *this,session_interface *session,string *data,time_t timeout,bool param_4
          ,bool on_server)

{
  encryptor *peVar1;
  long *plVar2;
  runtime_error *this_00;
  size_type *psVar3;
  undefined3 in_register_00000089;
  string real_data;
  string cdata;
  string cipher;
  string local_b0;
  time_t local_90;
  string local_88;
  string local_68;
  string local_48;
  
  local_90 = timeout;
  if (CONCAT31(in_register_00000089,on_server) == 0) {
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::reserve((ulong)&local_b0);
    std::__cxx11::string::append((char *)&local_b0,(ulong)&local_90);
    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(data->_M_dataplus)._M_p);
    peVar1 = (this->encryptor_)._M_t.
             super___uniq_ptr_impl<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::sessions::encryptor_*,_std::default_delete<cppcms::sessions::encryptor>_>
             .super__Head_base<0UL,_cppcms::sessions::encryptor_*,_false>._M_head_impl;
    (**peVar1->_vptr_encryptor)(&local_48,peVar1,&local_b0);
    b64url::encode(&local_68,&local_48);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x246e6d);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_88.field_2._M_allocated_capacity = *psVar3;
      local_88.field_2._8_8_ = plVar2[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar3;
      local_88._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_88._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    session_interface::set_session_cookie(session,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Can\'t use cookies backend when data should be stored on server",
             "");
  booster::runtime_error::runtime_error(this_00,&local_b0);
  *(undefined ***)this_00 = &PTR__runtime_error_00287810;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void session_cookies::save(session_interface &session,string const &data,time_t timeout,bool /*not_used*/,bool on_server)
{
	if(on_server)
		throw cppcms_error("Can't use cookies backend when data should be stored on server");
	std::string real_data;
	real_data.reserve(data.size() + sizeof(timeout));
	real_data.append(reinterpret_cast<char *>(&timeout),sizeof(timeout));
	real_data+=data;
	std::string cipher = encryptor_->encrypt(real_data);
	string cdata="C" + b64url::encode(cipher);
	session.set_session_cookie(cdata);
}